

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx512::
     BVHNIntersectorKHybrid<4,_8,_1,_false,_embree::avx512::ArrayIntersectorK_1<8,_embree::avx512::InstanceIntersectorK<8>_>,_false>
     ::intersect(vint<8> *valid_i,Intersectors *This,RayHitK<8> *ray,RayQueryContext *context)

{
  ulong *puVar1;
  undefined4 uVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  NodeRef nodeRef;
  undefined1 (*pauVar17) [32];
  ulong uVar18;
  ulong uVar19;
  Primitive *prim;
  long lVar20;
  ulong *puVar21;
  bool bVar22;
  byte bVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 in_ZMM0 [64];
  undefined1 auVar31 [64];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [64];
  undefined1 auVar41 [64];
  undefined1 auVar42 [64];
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 auVar45 [64];
  undefined1 in_ZMM15 [64];
  undefined1 auVar46 [64];
  undefined1 auVar47 [64];
  undefined1 auVar48 [64];
  vbool<8>_conflict valid_leaf;
  Precalculations pre;
  NodeRef stack_node [241];
  vfloat<8> stack_near [241];
  vbool<8>_conflict local_2732;
  Precalculations local_2731;
  RayHitK<8> *local_2730;
  RayQueryContext *local_2728;
  undefined1 local_2720 [32];
  undefined1 local_2700 [32];
  undefined1 local_26e0 [32];
  undefined1 local_26c0 [32];
  undefined1 local_26a0 [32];
  undefined1 local_2680 [32];
  undefined1 local_2660 [32];
  undefined1 local_2640 [32];
  undefined8 uStack_2610;
  ulong local_2608 [241];
  undefined1 local_1e80 [32];
  undefined1 local_1e60 [32];
  undefined1 local_1e40 [7696];
  undefined1 auVar30 [32];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    if ((context->user == (RTCRayQueryContext *)0x0) ||
       ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) == RTC_RAY_QUERY_FLAG_INCOHERENT)) {
      auVar26 = vpcmpeqd_avx2(in_ZMM0._0_32_,in_ZMM0._0_32_);
      uVar18 = vpcmpeqd_avx512vl(auVar26,(undefined1  [32])valid_i->field_0);
      bVar23 = (byte)uVar18;
      if (bVar23 != 0) {
        auVar26 = *(undefined1 (*) [32])(ray + 0x80);
        auVar29 = *(undefined1 (*) [32])(ray + 0xa0);
        auVar27 = *(undefined1 (*) [32])(ray + 0xc0);
        auVar32._8_4_ = 0x7fffffff;
        auVar32._0_8_ = 0x7fffffff7fffffff;
        auVar32._12_4_ = 0x7fffffff;
        auVar32._16_4_ = 0x7fffffff;
        auVar32._20_4_ = 0x7fffffff;
        auVar32._24_4_ = 0x7fffffff;
        auVar32._28_4_ = 0x7fffffff;
        auVar25 = vandps_avx(auVar27,auVar32);
        auVar34._8_4_ = 0x219392ef;
        auVar34._0_8_ = 0x219392ef219392ef;
        auVar34._12_4_ = 0x219392ef;
        auVar34._16_4_ = 0x219392ef;
        auVar34._20_4_ = 0x219392ef;
        auVar34._24_4_ = 0x219392ef;
        auVar34._28_4_ = 0x219392ef;
        uVar14 = vcmpps_avx512vl(auVar25,auVar34,1);
        bVar4 = (bool)((byte)uVar14 & 1);
        auVar25._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._0_4_;
        bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar25._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._4_4_;
        bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar25._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._8_4_;
        bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar25._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._12_4_;
        bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar25._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._16_4_;
        bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar25._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._20_4_;
        bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar25._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._24_4_;
        bVar4 = SUB81(uVar14 >> 7,0);
        auVar25._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar27._28_4_;
        auVar24 = vrcp14ps_avx512vl(auVar25);
        auVar37._8_4_ = 0x3f800000;
        auVar37._0_8_ = &DAT_3f8000003f800000;
        auVar37._12_4_ = 0x3f800000;
        auVar37._16_4_ = 0x3f800000;
        auVar37._20_4_ = 0x3f800000;
        auVar37._24_4_ = 0x3f800000;
        auVar37._28_4_ = 0x3f800000;
        auVar11 = vfnmadd213ps_fma(auVar25,auVar24,auVar37);
        auVar27 = vandps_avx(auVar29,auVar32);
        uVar14 = vcmpps_avx512vl(auVar27,auVar34,1);
        bVar4 = (bool)((byte)uVar14 & 1);
        auVar27._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar29._0_4_;
        bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar27._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar29._4_4_;
        bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar27._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar29._8_4_;
        bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar27._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar29._12_4_;
        bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar27._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar29._16_4_;
        bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar27._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar29._20_4_;
        bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar27._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar29._24_4_;
        bVar4 = SUB81(uVar14 >> 7,0);
        auVar27._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar29._28_4_;
        auVar25 = vrcp14ps_avx512vl(auVar27);
        auVar12 = vfnmadd213ps_fma(auVar27,auVar25,auVar37);
        auVar29 = vandps_avx(auVar26,auVar32);
        uVar14 = vcmpps_avx512vl(auVar29,auVar34,1);
        bVar4 = (bool)((byte)uVar14 & 1);
        auVar29._0_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar26._0_4_;
        bVar4 = (bool)((byte)(uVar14 >> 1) & 1);
        auVar29._4_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar26._4_4_;
        bVar4 = (bool)((byte)(uVar14 >> 2) & 1);
        auVar29._8_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar26._8_4_;
        bVar4 = (bool)((byte)(uVar14 >> 3) & 1);
        auVar29._12_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar26._12_4_;
        bVar4 = (bool)((byte)(uVar14 >> 4) & 1);
        auVar29._16_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar26._16_4_;
        bVar4 = (bool)((byte)(uVar14 >> 5) & 1);
        auVar29._20_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar26._20_4_;
        bVar4 = (bool)((byte)(uVar14 >> 6) & 1);
        auVar29._24_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar26._24_4_;
        bVar4 = SUB81(uVar14 >> 7,0);
        auVar29._28_4_ = (uint)bVar4 * 0x219392ef | (uint)!bVar4 * auVar26._28_4_;
        auVar26 = vrcp14ps_avx512vl(auVar29);
        auVar13 = vfnmadd213ps_fma(auVar29,auVar26,auVar37);
        auVar13 = vfmadd132ps_fma(ZEXT1632(auVar13),auVar26,auVar26);
        auVar40 = ZEXT1664(auVar13);
        auVar12 = vfmadd132ps_fma(ZEXT1632(auVar12),auVar25,auVar25);
        auVar41 = ZEXT1664(auVar12);
        auVar11 = vfmadd132ps_fma(ZEXT1632(auVar11),auVar24,auVar24);
        auVar42 = ZEXT1664(auVar11);
        local_1e80._8_4_ = 0x7f800000;
        local_1e80._0_8_ = 0x7f8000007f800000;
        local_1e80._12_4_ = 0x7f800000;
        local_1e80._16_4_ = 0x7f800000;
        local_1e80._20_4_ = 0x7f800000;
        local_1e80._24_4_ = 0x7f800000;
        local_1e80._28_4_ = 0x7f800000;
        auVar43 = ZEXT3264(local_1e80);
        auVar26 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x60),ZEXT1632(ZEXT816(0) << 0x40));
        local_1e60._0_4_ =
             (uint)(bVar23 & 1) * auVar26._0_4_ | (uint)!(bool)(bVar23 & 1) * 0x7f800000;
        bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
        local_1e60._4_4_ = (uint)bVar4 * auVar26._4_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar18 >> 2) & 1);
        local_1e60._8_4_ = (uint)bVar4 * auVar26._8_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar18 >> 3) & 1);
        local_1e60._12_4_ = (uint)bVar4 * auVar26._12_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar18 >> 4) & 1);
        local_1e60._16_4_ = (uint)bVar4 * auVar26._16_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar18 >> 5) & 1);
        local_1e60._20_4_ = (uint)bVar4 * auVar26._20_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = (bool)((byte)(uVar18 >> 6) & 1);
        local_1e60._24_4_ = (uint)bVar4 * auVar26._24_4_ | (uint)!bVar4 * 0x7f800000;
        bVar4 = SUB81(uVar18 >> 7,0);
        local_1e60._28_4_ = (uint)bVar4 * auVar26._28_4_ | (uint)!bVar4 * 0x7f800000;
        auVar44 = ZEXT3264(local_1e60);
        auVar26 = vmaxps_avx512vl(*(undefined1 (*) [32])(ray + 0x100),ZEXT1632(ZEXT816(0) << 0x40));
        bVar4 = (bool)((byte)(uVar18 >> 1) & 1);
        bVar22 = (bool)((byte)(uVar18 >> 2) & 1);
        bVar5 = (bool)((byte)(uVar18 >> 3) & 1);
        bVar6 = (bool)((byte)(uVar18 >> 4) & 1);
        bVar7 = (bool)((byte)(uVar18 >> 5) & 1);
        bVar8 = (bool)((byte)(uVar18 >> 6) & 1);
        bVar9 = SUB81(uVar18 >> 7,0);
        auVar45 = ZEXT3264(CONCAT428((uint)bVar9 * auVar26._28_4_ | (uint)!bVar9 * -0x800000,
                                     CONCAT424((uint)bVar8 * auVar26._24_4_ |
                                               (uint)!bVar8 * -0x800000,
                                               CONCAT420((uint)bVar7 * auVar26._20_4_ |
                                                         (uint)!bVar7 * -0x800000,
                                                         CONCAT416((uint)bVar6 * auVar26._16_4_ |
                                                                   (uint)!bVar6 * -0x800000,
                                                                   CONCAT412((uint)bVar5 *
                                                                             auVar26._12_4_ |
                                                                             (uint)!bVar5 *
                                                                             -0x800000,
                                                                             CONCAT48((uint)bVar22 *
                                                                                      auVar26._8_4_
                                                                                      | (uint)!
                                                  bVar22 * -0x800000,
                                                  CONCAT44((uint)bVar4 * auVar26._4_4_ |
                                                           (uint)!bVar4 * -0x800000,
                                                           (uint)(bVar23 & 1) * auVar26._0_4_ |
                                                           (uint)!(bool)(bVar23 & 1) * -0x800000))))
                                                  ))));
        puVar21 = local_2608 + 1;
        pauVar17 = (undefined1 (*) [32])local_1e40;
        auVar46._0_4_ = auVar13._0_4_ * -*(float *)ray;
        auVar46._4_4_ = auVar13._4_4_ * -*(float *)(ray + 4);
        auVar46._8_4_ = auVar13._8_4_ * -*(float *)(ray + 8);
        auVar46._12_4_ = auVar13._12_4_ * -*(float *)(ray + 0xc);
        auVar46._16_4_ = -*(float *)(ray + 0x10) * 0.0;
        auVar46._20_4_ = -*(float *)(ray + 0x14) * 0.0;
        auVar46._28_36_ = in_ZMM15._28_36_;
        auVar46._24_4_ = -*(float *)(ray + 0x18) * 0.0;
        auVar46 = ZEXT3264(auVar46._0_32_);
        auVar26 = *(undefined1 (*) [32])(ray + 0x20);
        auVar28._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
        auVar28._8_4_ = auVar26._8_4_ ^ 0x80000000;
        auVar28._12_4_ = auVar26._12_4_ ^ 0x80000000;
        auVar28._16_4_ = auVar26._16_4_ ^ 0x80000000;
        auVar28._20_4_ = auVar26._20_4_ ^ 0x80000000;
        auVar28._24_4_ = auVar26._24_4_ ^ 0x80000000;
        auVar28._28_4_ = auVar26._28_4_ ^ 0x80000000;
        auVar26 = *(undefined1 (*) [32])(ray + 0x40);
        auVar24._0_8_ = auVar26._0_8_ ^ 0x8000000080000000;
        auVar24._8_4_ = auVar26._8_4_ ^ 0x80000000;
        auVar24._12_4_ = auVar26._12_4_ ^ 0x80000000;
        auVar24._16_4_ = auVar26._16_4_ ^ 0x80000000;
        auVar24._20_4_ = auVar26._20_4_ ^ 0x80000000;
        auVar24._24_4_ = auVar26._24_4_ ^ 0x80000000;
        auVar24._28_4_ = auVar26._28_4_ ^ 0x80000000;
        auVar26 = vmulps_avx512vl(ZEXT1632(auVar12),auVar28);
        auVar47 = ZEXT3264(auVar26);
        auVar26 = vmulps_avx512vl(ZEXT1632(auVar11),auVar24);
        auVar48 = ZEXT3264(auVar26);
        uStack_2610 = 0xfffffffffffffff8;
        local_2608[0] = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
        local_2728 = context;
        local_2730 = ray;
        do {
          pauVar17 = pauVar17 + -1;
          puVar1 = puVar21 + -1;
          puVar21 = puVar21 + -1;
          bVar4 = true;
          if (*puVar1 != 0xfffffffffffffff8) {
            auVar31 = ZEXT3264(*pauVar17);
            local_26c0 = auVar45._0_32_;
            uVar10 = vcmpps_avx512vl(*pauVar17,local_26c0,1);
            uVar18 = *puVar1;
            if ((char)uVar10 != '\0') {
              do {
                local_2640 = auVar40._0_32_;
                local_26e0 = auVar46._0_32_;
                local_2660 = auVar41._0_32_;
                local_2700 = auVar47._0_32_;
                local_2680 = auVar42._0_32_;
                local_2720 = auVar48._0_32_;
                local_26a0 = auVar44._0_32_;
                if ((uVar18 & 8) != 0) {
                  if (uVar18 == 0xfffffffffffffff8) goto LAB_007b9ff7;
                  uVar10 = vcmpps_avx512vl(local_26c0,auVar31._0_32_,6);
                  local_2732.v = (__mmask8)uVar10;
                  if (local_2732.v != 0) {
                    lVar20 = (ulong)((uint)uVar18 & 0xf) - 8;
                    if (lVar20 != 0) {
                      prim = (Primitive *)(uVar18 & 0xfffffffffffffff0);
                      do {
                        InstanceIntersectorK<8>::intersect
                                  (&local_2732,&local_2731,local_2730,local_2728,prim);
                        prim = prim + 1;
                        lVar20 = lVar20 + -1;
                      } while (lVar20 != 0);
                    }
                    bVar4 = (bool)(local_2732.v >> 1 & 1);
                    bVar22 = (bool)(local_2732.v >> 2 & 1);
                    bVar5 = (bool)(local_2732.v >> 3 & 1);
                    bVar6 = (bool)(local_2732.v >> 4 & 1);
                    bVar7 = (bool)(local_2732.v >> 5 & 1);
                    bVar8 = (bool)(local_2732.v >> 6 & 1);
                    auVar45 = ZEXT3264(CONCAT428((uint)(local_2732.v >> 7) *
                                                 *(int *)(local_2730 + 0x11c) |
                                                 (uint)!(bool)(local_2732.v >> 7) *
                                                 local_26c0._28_4_,
                                                 CONCAT424((uint)bVar8 *
                                                           *(int *)(local_2730 + 0x118) |
                                                           (uint)!bVar8 * local_26c0._24_4_,
                                                           CONCAT420((uint)bVar7 *
                                                                     *(int *)(local_2730 + 0x114) |
                                                                     (uint)!bVar7 *
                                                                     local_26c0._20_4_,
                                                                     CONCAT416((uint)bVar6 *
                                                                               *(int *)(local_2730 +
                                                                                       0x110) |
                                                                               (uint)!bVar6 *
                                                                               local_26c0._16_4_,
                                                                               CONCAT412((uint)bVar5
                                                                                         * *(int *)(
                                                  local_2730 + 0x10c) |
                                                  (uint)!bVar5 * local_26c0._12_4_,
                                                  CONCAT48((uint)bVar22 *
                                                           *(int *)(local_2730 + 0x108) |
                                                           (uint)!bVar22 * local_26c0._8_4_,
                                                           CONCAT44((uint)bVar4 *
                                                                    *(int *)(local_2730 + 0x104) |
                                                                    (uint)!bVar4 * local_26c0._4_4_,
                                                                    (uint)(local_2732.v & 1) *
                                                                    *(int *)(local_2730 + 0x100) |
                                                                    (uint)!(bool)(local_2732.v & 1)
                                                                    * local_26c0._0_4_))))))));
                    auVar40 = ZEXT3264(local_2640);
                    auVar41 = ZEXT3264(local_2660);
                    auVar42 = ZEXT3264(local_2680);
                    auVar43 = ZEXT3264(CONCAT428(0x7f800000,
                                                 CONCAT424(0x7f800000,
                                                           CONCAT420(0x7f800000,
                                                                     CONCAT416(0x7f800000,
                                                                               CONCAT412(0x7f800000,
                                                                                         CONCAT48(
                                                  0x7f800000,0x7f8000007f800000)))))));
                    auVar44 = ZEXT3264(local_26a0);
                    auVar46 = ZEXT3264(local_26e0);
                    auVar47 = ZEXT3264(local_2700);
                    auVar48 = ZEXT3264(local_2720);
                  }
                  break;
                }
                uVar16 = 0;
                auVar31 = ZEXT3264(auVar43._0_32_);
                uVar14 = 0;
                uVar19 = 8;
                do {
                  uVar3 = *(ulong *)((uVar18 & 0xfffffffffffffff0) + uVar14 * 8);
                  if (uVar3 != 8) {
                    uVar2 = *(undefined4 *)(uVar18 + 0x20 + uVar14 * 4);
                    auVar26._4_4_ = uVar2;
                    auVar26._0_4_ = uVar2;
                    auVar26._8_4_ = uVar2;
                    auVar26._12_4_ = uVar2;
                    auVar26._16_4_ = uVar2;
                    auVar26._20_4_ = uVar2;
                    auVar26._24_4_ = uVar2;
                    auVar26._28_4_ = uVar2;
                    auVar13 = vfmadd132ps_fma(auVar26,local_26e0,local_2640);
                    uVar2 = *(undefined4 *)(uVar18 + 0x40 + uVar14 * 4);
                    auVar33._4_4_ = uVar2;
                    auVar33._0_4_ = uVar2;
                    auVar33._8_4_ = uVar2;
                    auVar33._12_4_ = uVar2;
                    auVar33._16_4_ = uVar2;
                    auVar33._20_4_ = uVar2;
                    auVar33._24_4_ = uVar2;
                    auVar33._28_4_ = uVar2;
                    auVar27 = vfmadd132ps_avx512vl(auVar33,local_2700,local_2660);
                    uVar2 = *(undefined4 *)(uVar18 + 0x60 + uVar14 * 4);
                    auVar35._4_4_ = uVar2;
                    auVar35._0_4_ = uVar2;
                    auVar35._8_4_ = uVar2;
                    auVar35._12_4_ = uVar2;
                    auVar35._16_4_ = uVar2;
                    auVar35._20_4_ = uVar2;
                    auVar35._24_4_ = uVar2;
                    auVar35._28_4_ = uVar2;
                    auVar24 = vfmadd132ps_avx512vl(auVar35,local_2720,local_2680);
                    uVar2 = *(undefined4 *)(uVar18 + 0x30 + uVar14 * 4);
                    auVar36._4_4_ = uVar2;
                    auVar36._0_4_ = uVar2;
                    auVar36._8_4_ = uVar2;
                    auVar36._12_4_ = uVar2;
                    auVar36._16_4_ = uVar2;
                    auVar36._20_4_ = uVar2;
                    auVar36._24_4_ = uVar2;
                    auVar36._28_4_ = uVar2;
                    auVar12 = vfmadd132ps_fma(auVar36,local_26e0,local_2640);
                    uVar2 = *(undefined4 *)(uVar18 + 0x50 + uVar14 * 4);
                    auVar38._4_4_ = uVar2;
                    auVar38._0_4_ = uVar2;
                    auVar38._8_4_ = uVar2;
                    auVar38._12_4_ = uVar2;
                    auVar38._16_4_ = uVar2;
                    auVar38._20_4_ = uVar2;
                    auVar38._24_4_ = uVar2;
                    auVar38._28_4_ = uVar2;
                    auVar25 = vfmadd132ps_avx512vl(auVar38,local_2700,local_2660);
                    uVar2 = *(undefined4 *)(uVar18 + 0x70 + uVar14 * 4);
                    auVar39._4_4_ = uVar2;
                    auVar39._0_4_ = uVar2;
                    auVar39._8_4_ = uVar2;
                    auVar39._12_4_ = uVar2;
                    auVar39._16_4_ = uVar2;
                    auVar39._20_4_ = uVar2;
                    auVar39._24_4_ = uVar2;
                    auVar39._28_4_ = uVar2;
                    auVar28 = vfmadd132ps_avx512vl(auVar39,local_2720,local_2680);
                    auVar26 = vpminsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar12));
                    auVar29 = vpminsd_avx2(auVar27,auVar25);
                    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
                    auVar29 = vpminsd_avx2(auVar24,auVar28);
                    auVar26 = vpmaxsd_avx2(auVar26,auVar29);
                    auVar29 = vpmaxsd_avx2(ZEXT1632(auVar13),ZEXT1632(auVar12));
                    auVar27 = vpmaxsd_avx2(auVar27,auVar25);
                    auVar25 = vpminsd_avx2(auVar29,auVar27);
                    auVar29 = vpmaxsd_avx2(auVar24,auVar28);
                    auVar27 = vpmaxsd_avx2(auVar26,local_26a0);
                    auVar29 = vpminsd_avx2(auVar29,local_26c0);
                    auVar29 = vpminsd_avx2(auVar25,auVar29);
                    uVar15 = vpcmpd_avx512vl(auVar27,auVar29,2);
                    if ((byte)uVar15 != 0) {
                      auVar29 = vblendmps_avx512vl(auVar43._0_32_,auVar26);
                      bVar22 = (bool)((byte)uVar15 & 1);
                      auVar30._0_4_ = (uint)bVar22 * auVar29._0_4_ | (uint)!bVar22 * auVar26._0_4_;
                      bVar22 = (bool)((byte)(uVar15 >> 1) & 1);
                      auVar30._4_4_ = (uint)bVar22 * auVar29._4_4_ | (uint)!bVar22 * auVar26._4_4_;
                      bVar22 = (bool)((byte)(uVar15 >> 2) & 1);
                      auVar30._8_4_ = (uint)bVar22 * auVar29._8_4_ | (uint)!bVar22 * auVar26._8_4_;
                      bVar22 = (bool)((byte)(uVar15 >> 3) & 1);
                      auVar30._12_4_ =
                           (uint)bVar22 * auVar29._12_4_ | (uint)!bVar22 * auVar26._12_4_;
                      bVar22 = (bool)((byte)(uVar15 >> 4) & 1);
                      auVar30._16_4_ =
                           (uint)bVar22 * auVar29._16_4_ | (uint)!bVar22 * auVar26._16_4_;
                      bVar22 = (bool)((byte)(uVar15 >> 5) & 1);
                      auVar30._20_4_ =
                           (uint)bVar22 * auVar29._20_4_ | (uint)!bVar22 * auVar26._20_4_;
                      bVar22 = (bool)((byte)(uVar15 >> 6) & 1);
                      auVar30._24_4_ =
                           (uint)bVar22 * auVar29._24_4_ | (uint)!bVar22 * auVar26._24_4_;
                      bVar22 = SUB81(uVar15 >> 7,0);
                      auVar30._28_4_ =
                           (uint)bVar22 * auVar29._28_4_ | (uint)!bVar22 * auVar26._28_4_;
                      auVar27 = auVar31._0_32_;
                      uVar10 = vcmpps_avx512vl(auVar30,auVar27,1);
                      uVar15 = uVar3;
                      auVar26 = auVar27;
                      auVar29 = auVar30;
                      if (((char)uVar10 == '\0') ||
                         (bVar22 = uVar19 != 8, uVar15 = uVar19, uVar19 = uVar3, auVar26 = auVar30,
                         auVar29 = auVar27, bVar22)) {
                        uVar16 = uVar16 + 1;
                        *puVar21 = uVar15;
                        puVar21 = puVar21 + 1;
                        *pauVar17 = auVar29;
                        pauVar17 = pauVar17 + 1;
                        auVar31 = ZEXT3264(auVar26);
                      }
                      else {
                        auVar31 = ZEXT3264(auVar30);
                      }
                    }
                  }
                } while ((uVar3 != 8) && (bVar22 = uVar14 < 3, uVar14 = uVar14 + 1, bVar22));
                if (1 < uVar16 && uVar19 != 8) {
                  auVar26 = pauVar17[-2];
                  uVar10 = vcmpps_avx512vl(auVar26,pauVar17[-1],1);
                  if ((char)uVar10 != '\0') {
                    pauVar17[-2] = pauVar17[-1];
                    pauVar17[-1] = auVar26;
                    auVar13 = vpermilps_avx(*(undefined1 (*) [16])(puVar21 + -2),0x4e);
                    *(undefined1 (*) [16])(puVar21 + -2) = auVar13;
                  }
                  if (uVar16 != 2) {
                    auVar26 = pauVar17[-3];
                    uVar10 = vcmpps_avx512vl(auVar26,pauVar17[-1],1);
                    if ((char)uVar10 != '\0') {
                      pauVar17[-3] = pauVar17[-1];
                      pauVar17[-1] = auVar26;
                      uVar18 = puVar21[-3];
                      puVar21[-3] = puVar21[-1];
                      puVar21[-1] = uVar18;
                    }
                    auVar26 = pauVar17[-3];
                    uVar10 = vcmpps_avx512vl(auVar26,pauVar17[-2],1);
                    if ((char)uVar10 != '\0') {
                      pauVar17[-3] = pauVar17[-2];
                      pauVar17[-2] = auVar26;
                      auVar13 = vpermilps_avx(*(undefined1 (*) [16])(puVar21 + -3),0x4e);
                      *(undefined1 (*) [16])(puVar21 + -3) = auVar13;
                    }
                  }
                }
                uVar18 = uVar19;
              } while (uVar19 != 8);
            }
            bVar4 = false;
          }
LAB_007b9ff7:
        } while (!bVar4);
      }
    }
    else {
      intersectCoherent(valid_i,This,ray,context);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }